

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

FunctionPrototypeSyntax * __thiscall
slang::parsing::Parser::parseFunctionPrototype
          (Parser *this,SyntaxKind parentKind,
          bitmask<slang::parsing::detail::FunctionOptions> options,bool *isConstructor)

{
  Token placeholder;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> elements;
  Token lifetime_00;
  Token signing;
  Token keyword_00;
  SourceRange range_05;
  SourceRange range_06;
  SourceRange range_07;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  bool bVar1;
  SyntaxNode *this_00;
  ScopedNameSyntax *pSVar2;
  Preprocessor *pPVar3;
  FunctionPortListSyntax *pFVar4;
  FunctionPrototypeSyntax *pFVar5;
  long in_RCX;
  int in_ESI;
  ParserBase *in_RDI;
  Token TVar6;
  Parser *in_stack_00000010;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_0000001c;
  FunctionPortListSyntax *portList;
  SyntaxNode *savedPN;
  bool constructor;
  NameSyntax *name;
  Token next;
  uint32_t index;
  DataTypeSyntax *returnType;
  Token lifetime;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> specifiers;
  bool allowSpecifiers;
  Token keyword;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffc98;
  Parser *in_stack_fffffffffffffca0;
  undefined6 in_stack_fffffffffffffca8;
  TokenKind in_stack_fffffffffffffcae;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffcb0;
  ParserBase *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  SourceLocation in_stack_fffffffffffffcc8;
  Diagnostic *in_stack_fffffffffffffcd0;
  Diagnostic *in_stack_fffffffffffffcd8;
  Diagnostic *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  undefined1 uVar7;
  Parser *in_stack_fffffffffffffcf8;
  ParserBase *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 uVar8;
  undefined8 in_stack_fffffffffffffd28;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffd30;
  Token local_260;
  SourceLocation local_250;
  undefined4 local_248;
  bitmask<slang::parsing::detail::FunctionOptions> local_244;
  SourceRange local_240;
  SourceRange local_230;
  undefined4 local_21c;
  SourceRange local_218;
  SourceLocation local_208;
  undefined4 local_1fc;
  SourceRange local_1f8;
  Token local_1e8;
  SourceLocation local_1d8;
  undefined4 local_1cc;
  SourceRange local_1c8;
  SourceLocation local_1b8;
  undefined4 local_1ac;
  SourceRange local_1a8;
  SourceLocation local_198;
  undefined4 in_stack_fffffffffffffe70;
  bitmask<slang::parsing::detail::FunctionOptions> in_stack_fffffffffffffe74;
  TokenKind local_188;
  Token local_158;
  SourceLocation local_148;
  undefined4 local_140;
  bitmask<slang::parsing::detail::FunctionOptions> local_13c [2];
  TokenKind local_b0;
  ImplicitTypeSyntax *local_98;
  bitmask<slang::parsing::detail::FunctionOptions> local_7c;
  Token local_78;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> local_68;
  bitmask<slang::parsing::detail::FunctionOptions> local_58;
  byte local_51;
  Token local_50;
  Token local_40;
  Token local_30;
  long local_20;
  int local_14;
  bitmask<slang::parsing::detail::FunctionOptions> local_4;
  
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffce8 >> 0x38);
  kind = (TokenKind)((ulong)in_stack_fffffffffffffd28 >> 0x30);
  local_20 = in_RCX;
  local_14 = in_ESI;
  Token::Token((Token *)in_stack_fffffffffffffca0);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffcb0._M_extent_value,
                           in_stack_fffffffffffffcae);
  if (bVar1) {
    TVar6 = ParserBase::consume((ParserBase *)
                                CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    local_40._0_8_ = TVar6._0_8_;
    local_30.kind = local_40.kind;
    local_30._2_1_ = local_40._2_1_;
    local_30.numFlags.raw = local_40.numFlags.raw;
    local_30.rawLen = local_40.rawLen;
    local_40.info = TVar6.info;
    local_30.info = local_40.info;
    local_40 = TVar6;
  }
  else {
    TVar6 = ParserBase::expect(in_stack_fffffffffffffd30,kind);
    local_50._0_8_ = TVar6._0_8_;
    local_30.kind = local_50.kind;
    local_30._2_1_ = local_50._2_1_;
    local_30.numFlags.raw = local_50.numFlags.raw;
    local_30.rawLen = local_50.rawLen;
    local_50.info = TVar6.info;
    local_30.info = local_50.info;
    local_50 = TVar6;
  }
  bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_58,AllowOverrideSpecifiers);
  local_51 = bitmask<slang::parsing::detail::FunctionOptions>::has
                       ((bitmask<slang::parsing::detail::FunctionOptions> *)
                        in_stack_fffffffffffffca0,
                        (bitmask<slang::parsing::detail::FunctionOptions> *)
                        in_stack_fffffffffffffc98);
  local_68 = parseClassSpecifierList((Parser *)local_13c._12_8_,local_13c[2].m_bits._3_1_);
  local_78 = parseLifetime((Parser *)in_stack_fffffffffffffcb0._M_extent_value);
  bVar1 = Token::operator_cast_to_bool((Token *)0x8a251c);
  uVar8 = false;
  if (bVar1) {
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_7c,IsPrototype);
    uVar8 = bitmask<slang::parsing::detail::FunctionOptions>::has
                      ((bitmask<slang::parsing::detail::FunctionOptions> *)in_stack_fffffffffffffca0
                       ,(bitmask<slang::parsing::detail::FunctionOptions> *)
                        in_stack_fffffffffffffc98);
  }
  if ((bool)uVar8 != false) {
    Token::range((Token *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    range_05.startLoc._7_1_ = in_stack_fffffffffffffcc7;
    range_05.startLoc._0_7_ = in_stack_fffffffffffffcc0;
    range_05.endLoc = in_stack_fffffffffffffcc8;
    ParserBase::addDiag(in_stack_fffffffffffffcb8,SUB84((ulong)in_stack_fffffffffffffcd0 >> 0x20,0),
                        range_05);
  }
  bVar1 = scanQualifiedName(in_stack_fffffffffffffcf8,
                            (uint32_t *)
                            CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                            (bool)uVar7);
  if (bVar1) {
    TVar6 = ParserBase::peek((ParserBase *)
                             CONCAT26(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8),
                             (uint32_t)((ulong)in_stack_fffffffffffffca0 >> 0x20));
    local_b0 = TVar6.kind;
    if ((local_b0 == Semicolon) || (local_b0 == OpenParenthesis)) {
      in_stack_fffffffffffffd00 = in_RDI + 1;
      Token::Token((Token *)in_stack_fffffffffffffca0);
      slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                 in_stack_fffffffffffffcb0._M_extent_value,
                 (nullptr_t)CONCAT26(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8));
      ParserBase::placeholderToken
                ((ParserBase *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      signing.info._0_7_ = in_stack_fffffffffffffcc0;
      signing._0_8_ = in_stack_fffffffffffffcb8;
      signing.info._7_1_ = in_stack_fffffffffffffcc7;
      placeholder.rawLen._2_2_ = in_stack_fffffffffffffcae;
      placeholder._0_6_ = in_stack_fffffffffffffca8;
      placeholder.info = (Info *)in_stack_fffffffffffffcb0._M_extent_value;
      local_98 = slang::syntax::SyntaxFactory::implicitType
                           ((SyntaxFactory *)in_stack_fffffffffffffca0,signing,
                            in_stack_fffffffffffffc98,placeholder);
    }
    else {
      detail::operator|((TypeOptions)in_stack_fffffffffffffca0,
                        (TypeOptions)((ulong)in_stack_fffffffffffffc98 >> 0x20));
      local_98 = (ImplicitTypeSyntax *)parseDataType(in_stack_00000010,in_stack_0000001c);
    }
  }
  else {
    detail::operator|((TypeOptions)in_stack_fffffffffffffca0,
                      (TypeOptions)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    local_98 = (ImplicitTypeSyntax *)parseDataType(in_stack_00000010,in_stack_0000001c);
  }
  this_00 = (SyntaxNode *)parseName(in_stack_fffffffffffffca0);
  bVar1 = checkSubroutineName((NameSyntax *)
                              CONCAT26(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8));
  if (!bVar1) {
    Token::location(&local_30);
    location._7_1_ = uVar8;
    location._0_7_ = in_stack_fffffffffffffd08;
    ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),location);
    join_0x00000010_0x00000000_ =
         slang::syntax::SyntaxNode::sourceRange
                   ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    range.startLoc._6_2_ = in_stack_fffffffffffffcae;
    range.startLoc._0_6_ = in_stack_fffffffffffffca8;
    range.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range);
  }
  bitmask<slang::parsing::detail::FunctionOptions>::bitmask(local_13c,IsPrototype);
  bVar1 = bitmask<slang::parsing::detail::FunctionOptions>::has
                    ((bitmask<slang::parsing::detail::FunctionOptions> *)in_stack_fffffffffffffca0,
                     (bitmask<slang::parsing::detail::FunctionOptions> *)in_stack_fffffffffffffc98);
  uVar7 = false;
  if (bVar1) {
    uVar7 = this_00->kind == ScopedName;
  }
  if ((bool)uVar7 == false) {
    if (((local_78.kind == StaticKeyword) && (this_00->kind == ScopedName)) &&
       (pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_00),
       (pSVar2->separator).kind == DoubleColon)) {
      Token::range((Token *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
      range_06.startLoc._7_1_ = in_stack_fffffffffffffcc7;
      range_06.startLoc._0_7_ = in_stack_fffffffffffffcc0;
      range_06.endLoc = in_stack_fffffffffffffcc8;
      ParserBase::addDiag(in_stack_fffffffffffffcb8,
                          SUB84((ulong)in_stack_fffffffffffffcd0 >> 0x20,0),range_06);
    }
  }
  else {
    local_140 = 0xa50005;
    local_158 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffcd0);
    local_148 = Token::location(&local_158);
    location_00._7_1_ = uVar8;
    location_00._0_7_ = in_stack_fffffffffffffd08;
    ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),location_00);
  }
  TVar6 = ParserBase::getLastConsumed(in_RDI);
  local_188 = TVar6.kind;
  bVar1 = local_188 == NewKeyword;
  if (local_20 != 0) {
    *(bool *)local_20 = bVar1;
  }
  if (bVar1) {
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask
              ((bitmask<slang::parsing::detail::FunctionOptions> *)&stack0xfffffffffffffe74,
               AllowDefaultArg);
    bitmask<slang::parsing::detail::FunctionOptions>::operator|=
              (&local_4,(bitmask<slang::parsing::detail::FunctionOptions> *)&stack0xfffffffffffffe74
              );
  }
  if (local_30.kind == TaskKeyword) {
    if ((local_98->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
        ImplicitType) {
      if (bVar1) {
        local_1ac = 0xa70005;
        local_1b8 = Token::location(&local_30);
        location_02._7_1_ = uVar8;
        location_02._0_7_ = in_stack_fffffffffffffd08;
        in_stack_fffffffffffffce0 =
             ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),
                                 location_02);
        local_1c8 = slang::syntax::SyntaxNode::sourceRange
                              ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
        range_01.startLoc._6_2_ = in_stack_fffffffffffffcae;
        range_01.startLoc._0_6_ = in_stack_fffffffffffffca8;
        range_01.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range_01);
      }
    }
    else {
      in_stack_fffffffffffffe70 = 0xa80005;
      local_198 = Token::location(&local_30);
      location_01._7_1_ = uVar8;
      location_01._0_7_ = in_stack_fffffffffffffd08;
      ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),location_01);
      local_1a8 = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
      range_00.startLoc._6_2_ = in_stack_fffffffffffffcae;
      range_00.startLoc._0_6_ = in_stack_fffffffffffffca8;
      range_00.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range_00);
    }
  }
  else if (bVar1) {
    if ((local_98->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
        ImplicitType) {
      if ((this_00->kind == ScopedName) || (local_14 == 0x48)) {
        if (((local_51 & 1) != 0) &&
           (bVar1 = std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::empty
                              ((span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>
                                *)0x8a2bda), !bVar1)) {
          local_21c = 0xa30005;
          std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::operator[]
                    (&local_68,0);
          local_230 = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
          range_07.startLoc._7_1_ = in_stack_fffffffffffffcc7;
          range_07.startLoc._0_7_ = in_stack_fffffffffffffcc0;
          range_07.endLoc = in_stack_fffffffffffffcc8;
          ParserBase::addDiag(in_stack_fffffffffffffcb8,
                              SUB84((ulong)in_stack_fffffffffffffcd0 >> 0x20,0),range_07);
          local_240 = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
          range_04.startLoc._6_2_ = in_stack_fffffffffffffcae;
          range_04.startLoc._0_6_ = in_stack_fffffffffffffca8;
          range_04.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range_04);
        }
      }
      else {
        local_1fc = 0x100005;
        local_208 = Token::location(&local_30);
        location_04._7_1_ = uVar8;
        location_04._0_7_ = in_stack_fffffffffffffd08;
        in_stack_fffffffffffffcd0 =
             ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),
                                 location_04);
        local_218 = slang::syntax::SyntaxNode::sourceRange
                              ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
        range_03.startLoc._6_2_ = in_stack_fffffffffffffcae;
        range_03.startLoc._0_6_ = in_stack_fffffffffffffca8;
        range_03.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range_03);
      }
    }
    else {
      local_1cc = 0x110005;
      local_1e8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffcd0);
      local_1d8 = Token::location(&local_1e8);
      location_03._7_1_ = uVar8;
      location_03._0_7_ = in_stack_fffffffffffffd08;
      in_stack_fffffffffffffcd8 =
           ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),location_03)
      ;
      local_1f8 = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)CONCAT17(uVar7,in_stack_fffffffffffffcf0));
      range_02.startLoc._6_2_ = in_stack_fffffffffffffcae;
      range_02.startLoc._0_6_ = in_stack_fffffffffffffca8;
      range_02.endLoc = (SourceLocation)in_stack_fffffffffffffcb0._M_extent_value;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffca0,range_02);
    }
  }
  else {
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_244,AllowImplicitReturn);
    bVar1 = bitmask<slang::parsing::detail::FunctionOptions>::has
                      ((bitmask<slang::parsing::detail::FunctionOptions> *)in_stack_fffffffffffffca0
                       ,(bitmask<slang::parsing::detail::FunctionOptions> *)
                        in_stack_fffffffffffffc98);
    in_stack_fffffffffffffcc7 = false;
    if (!bVar1) {
      in_stack_fffffffffffffcc7 =
           (local_98->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
           ImplicitType;
    }
    if ((bool)in_stack_fffffffffffffcc7 != false) {
      local_248 = 0x610005;
      local_260 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffcd0);
      local_250 = Token::location(&local_260);
      location_05._7_1_ = uVar8;
      location_05._0_7_ = in_stack_fffffffffffffd08;
      ParserBase::addDiag(in_stack_fffffffffffffd00,SUB84((ulong)in_RDI >> 0x20,0),location_05);
    }
  }
  pPVar3 = (Preprocessor *)
           std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                     ((SyntaxNode **)in_stack_fffffffffffffca0,(void **)in_stack_fffffffffffffc98);
  pFVar4 = parseFunctionPortList
                     ((Parser *)CONCAT44(in_stack_fffffffffffffe74.m_bits,in_stack_fffffffffffffe70)
                      ,(bitmask<slang::parsing::detail::FunctionOptions>)TVar6.rawLen);
  in_RDI[1].window.tokenSource = pPVar3;
  in_RDI = in_RDI + 1;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffcae;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffca8;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffcb0._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_stack_fffffffffffffca0,elements);
  keyword_00.info._0_7_ = in_stack_fffffffffffffcc0;
  keyword_00._0_8_ = in_RDI;
  keyword_00.info._7_1_ = in_stack_fffffffffffffcc7;
  lifetime_00.info = (Info *)in_stack_fffffffffffffcb0._M_extent_value;
  lifetime_00._0_8_ = pFVar4;
  pFVar5 = slang::syntax::SyntaxFactory::functionPrototype
                     ((SyntaxFactory *)this_00,keyword_00,
                      (SyntaxList<slang::syntax::ClassSpecifierSyntax> *)local_98,lifetime_00,
                      (DataTypeSyntax *)in_stack_fffffffffffffcd0,
                      (NameSyntax *)in_stack_fffffffffffffcd8,
                      (FunctionPortListSyntax *)in_stack_fffffffffffffce0);
  return pFVar5;
}

Assistant:

FunctionPrototypeSyntax& Parser::parseFunctionPrototype(SyntaxKind parentKind,
                                                        bitmask<FunctionOptions> options,
                                                        bool* isConstructor) {
    Token keyword;
    if (peek(TokenKind::TaskKeyword))
        keyword = consume();
    else
        keyword = expect(TokenKind::FunctionKeyword);

    const bool allowSpecifiers = options.has(FunctionOptions::AllowOverrideSpecifiers);
    auto specifiers = parseClassSpecifierList(allowSpecifiers);

    auto lifetime = parseLifetime();
    if (lifetime && options.has(FunctionOptions::IsPrototype))
        addDiag(diag::LifetimeForPrototype, lifetime.range());

    // Return type is optional for function declarations, and should not be given
    // for tasks and constructors (we'll check that below).
    DataTypeSyntax* returnType = nullptr;
    uint32_t index = 0;
    if (!scanQualifiedName(index, /* allowNew */ true))
        returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
    else {
        auto next = peek(index);
        if (next.kind != TokenKind::Semicolon && next.kind != TokenKind::OpenParenthesis)
            returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
        else
            returnType = &factory.implicitType(Token(), nullptr, placeholderToken());
    }

    auto& name = parseName();
    if (!checkSubroutineName(name))
        addDiag(diag::ExpectedSubroutineName, keyword.location()) << name.sourceRange();

    if (options.has(FunctionOptions::IsPrototype) && name.kind == SyntaxKind::ScopedName) {
        addDiag(diag::SubroutinePrototypeScoped, name.getFirstToken().location());
    }
    else if (lifetime.kind == TokenKind::StaticKeyword && name.kind == SyntaxKind::ScopedName &&
             name.as<ScopedNameSyntax>().separator.kind == TokenKind::DoubleColon) {
        addDiag(diag::MethodStaticLifetime, lifetime.range());
    }

    bool constructor = getLastConsumed().kind == TokenKind::NewKeyword;
    if (isConstructor)
        *isConstructor = constructor;

    if (constructor)
        options |= FunctionOptions::AllowDefaultArg;

    if (keyword.kind == TokenKind::TaskKeyword) {
        if (returnType->kind != SyntaxKind::ImplicitType)
            addDiag(diag::TaskReturnType, keyword.location()) << returnType->sourceRange();
        else if (constructor)
            addDiag(diag::TaskConstructor, keyword.location()) << name.sourceRange();
    }
    else if (constructor) {
        if (returnType->kind != SyntaxKind::ImplicitType) {
            addDiag(diag::ConstructorReturnType, name.getFirstToken().location())
                << returnType->sourceRange();
        }
        else if (name.kind != SyntaxKind::ScopedName &&
                 parentKind != SyntaxKind::ClassDeclaration) {
            addDiag(diag::ConstructorOutsideClass, keyword.location()) << name.sourceRange();
        }
        else if (allowSpecifiers && !specifiers.empty()) {
            addDiag(diag::SpecifiersNotAllowed, specifiers[0]->sourceRange()) << name.sourceRange();
        }
    }
    else if (!options.has(FunctionOptions::AllowImplicitReturn) &&
             returnType->kind == SyntaxKind::ImplicitType) {
        addDiag(diag::ImplicitNotAllowed, name.getFirstToken().location());
    }

    // If the function returns a declared enum type, save it off here
    // so that we don't suck it into the port list.
    auto savedPN = std::exchange(previewNode, nullptr);
    auto portList = parseFunctionPortList(options);
    previewNode = savedPN;

    return factory.functionPrototype(keyword, specifiers, lifetime, *returnType, name, portList);
}